

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::generateUniformBlockOffsetContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  SharedPtrStateBase *pSVar1;
  SharedPtrStateBase *pSVar2;
  TestNode *pTVar3;
  Node *pNVar4;
  Node *pNVar5;
  SharedPtrStateBase *pSVar6;
  ResourceTestCase *pRVar7;
  deInt32 *pdVar8;
  SharedPtr arrayElement;
  SharedPtr memberVariable;
  SharedPtr structMember;
  SharedPtr elementVariable;
  ProgramResourceQueryTestTarget queryTarget;
  SharedPtrStateBase *local_80;
  SharedPtr local_78;
  Node *local_68;
  SharedPtrStateBase *pSStack_60;
  MatrixOrder local_58;
  SharedPtr local_50;
  ProgramResourceQueryTestTarget local_40;
  TestNode *local_38;
  
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_40,PROGRAMINTERFACE_UNIFORM,0x200);
  pNVar5 = parentStructure->m_ptr;
  if (pNVar5->m_type == TYPE_INTERFACE_BLOCK) {
    if ((*(char *)&pNVar5[1]._vptr_Node == '\0') ||
       (((pNVar5->m_enclosingNode).m_ptr)->m_type == TYPE_ARRAY_ELEMENT)) {
      generateVariableCases(context,parentStructure,targetGroup,&local_40,1,true);
      generateVariableArrayCases(context,parentStructure,targetGroup,&local_40,1);
      generateCompoundVariableCases(context,parentStructure,targetGroup,&local_40,1);
      return;
    }
    pTVar3 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,context->m_testCtx,"types","Types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar3);
    generateVariableCases(context,parentStructure,(TestCaseGroup *)pTVar3,&local_40,3,false);
    generateOpaqueTypeCases(context,parentStructure,(TestCaseGroup *)pTVar3,&local_40,3,false);
    pTVar3 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar3,context->m_testCtx,"aggregates","Aggregate types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar3);
    pNVar4 = (Node *)operator_new(0x20);
    pNVar5 = parentStructure->m_ptr;
    pSVar6 = parentStructure->m_state;
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar4->m_type = TYPE_STRUCT_MEMBER;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar6;
    if (pSVar6 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34d08;
    pSStack_60 = (SharedPtrStateBase *)0x0;
    local_68 = pNVar4;
    pSStack_60 = (SharedPtrStateBase *)operator_new(0x20);
    pSStack_60->strongRefCount = 0;
    pSStack_60->weakRefCount = 0;
    pSStack_60->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSStack_60[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSStack_60->strongRefCount = 1;
    pSStack_60->weakRefCount = 1;
    pNVar4 = (Node *)operator_new(0x20);
    pNVar5 = parentStructure->m_ptr;
    pSVar6 = parentStructure->m_state;
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar4->m_type = TYPE_STRUCT_MEMBER;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar6;
    if (pSVar6 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34d08;
    local_80 = (SharedPtrStateBase *)operator_new(0x20);
    local_80->strongRefCount = 0;
    local_80->weakRefCount = 0;
    local_80->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    local_80[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    local_80->strongRefCount = 1;
    local_80->weakRefCount = 1;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = local_68;
    (pNVar5->m_enclosingNode).m_state = pSStack_60;
    if (pSStack_60 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_60->strongRefCount = pSStack_60->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 1;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar5;
    local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_78.m_state)->strongRefCount = 0;
    (local_78.m_state)->weakRefCount = 0;
    (local_78.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    local_78.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    (local_78.m_state)->strongRefCount = 1;
    (local_78.m_state)->weakRefCount = 1;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = pNVar4;
    (pNVar5->m_enclosingNode).m_state = local_80;
    if (local_80 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_80->strongRefCount = local_80->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 1;
    local_50.m_state = (SharedPtrStateBase *)0x0;
    local_50.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_50.m_state = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar7,context,&local_78,&local_40,"float_struct");
    tcu::TestNode::addChild(pTVar3,(TestNode *)pRVar7);
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar7,context,&local_50,&local_40,"float_array");
    tcu::TestNode::addChild(pTVar3,(TestNode *)pRVar7);
  }
  else {
    pTVar3 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,context->m_testCtx,"types","Types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar3);
    generateVariableCases(context,parentStructure,(TestCaseGroup *)pTVar3,&local_40,3,false);
    generateOpaqueTypeCases(context,parentStructure,(TestCaseGroup *)pTVar3,&local_40,3,false);
    pTVar3 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar3,context->m_testCtx,"aggregates","Aggregate types");
    local_38 = pTVar3;
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar3);
    pNVar4 = (Node *)operator_new(0x38);
    glu::Layout::Layout((Layout *)&local_68,-1,-1,4,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    pNVar5 = parentStructure->m_ptr;
    pSVar6 = parentStructure->m_state;
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar4->m_type = TYPE_LAYOUT_QUALIFIER;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar6;
    if (pSVar6 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34da0;
    pNVar4[1]._vptr_Node = (_func_int **)local_68;
    *(SharedPtrStateBase **)&pNVar4[1].m_type = pSStack_60;
    *(MatrixOrder *)&pNVar4[1].m_enclosingNode.m_ptr = local_58;
    pSVar1 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar1->strongRefCount = 0;
    pSVar1->weakRefCount = 0;
    pSVar1->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar1[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar1->strongRefCount = 1;
    pSVar1->weakRefCount = 1;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar5->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar5->m_enclosingNode).m_ptr = pNVar4;
    (pNVar5->m_enclosingNode).m_state = pSVar1;
    LOCK();
    pSVar1->strongRefCount = pSVar1->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 0xffffffff;
    pSStack_60 = (SharedPtrStateBase *)0x0;
    local_68 = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    pSStack_60 = pSVar6;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar4->m_type = TYPE_VARIABLE;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 0x54;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar4;
    pSVar2 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar2->strongRefCount = 0;
    pSVar2->weakRefCount = 0;
    pSVar2->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar2[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSVar2->strongRefCount = 1;
    pSVar2->weakRefCount = 1;
    local_78.m_state = pSVar2;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    pTVar3 = local_38;
    ResourceTestCase::ResourceTestCase(pRVar7,context,&local_78,&local_40,"atomic_uint_array");
    tcu::TestNode::addChild(pTVar3,(TestNode *)pRVar7);
    pSVar6 = local_78.m_state;
    pdVar8 = &pSVar2->strongRefCount;
    LOCK();
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
    }
    LOCK();
    pdVar8 = &pSVar6->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if ((*pdVar8 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pSVar6 = pSStack_60;
    if (pSStack_60 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &pSStack_60->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        local_68 = (Node *)0x0;
        (*pSStack_60->_vptr_SharedPtrStateBase[2])(pSStack_60);
      }
      LOCK();
      pdVar8 = &pSVar6->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if ((*pdVar8 == 0) && (pSStack_60 != (SharedPtrStateBase *)0x0)) {
        (*pSStack_60->_vptr_SharedPtrStateBase[1])();
      }
    }
    if (pSVar1 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar8 = &pSVar1->strongRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if (*pdVar8 == 0) {
        (*pSVar1->_vptr_SharedPtrStateBase[2])(pSVar1);
      }
      LOCK();
      pdVar8 = &pSVar1->weakRefCount;
      *pdVar8 = *pdVar8 + -1;
      UNLOCK();
      if ((*pdVar8 == 0) && (pSVar1 != (SharedPtrStateBase *)0x0)) {
        (*pSVar1->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar4 = (Node *)operator_new(0x20);
    pNVar5 = parentStructure->m_ptr;
    pSVar6 = parentStructure->m_state;
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar4->m_type = TYPE_STRUCT_MEMBER;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar6;
    if (pSVar6 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34d08;
    pSStack_60 = (SharedPtrStateBase *)0x0;
    local_68 = pNVar4;
    pSStack_60 = (SharedPtrStateBase *)operator_new(0x20);
    pSStack_60->strongRefCount = 0;
    pSStack_60->weakRefCount = 0;
    pSStack_60->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSStack_60[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    pSStack_60->strongRefCount = 1;
    pSStack_60->weakRefCount = 1;
    pNVar4 = (Node *)operator_new(0x28);
    pNVar5 = parentStructure->m_ptr;
    pSVar6 = parentStructure->m_state;
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar4->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar4->m_enclosingNode).m_ptr = pNVar5;
    (pNVar4->m_enclosingNode).m_state = pSVar6;
    if (pSVar6 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar4->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
    *(undefined4 *)&pNVar4[1]._vptr_Node = 0xffffffff;
    local_80 = (SharedPtrStateBase *)operator_new(0x20);
    local_80->strongRefCount = 0;
    local_80->weakRefCount = 0;
    local_80->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    local_80[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
    local_80->strongRefCount = 1;
    local_80->weakRefCount = 1;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = local_68;
    (pNVar5->m_enclosingNode).m_state = pSStack_60;
    if (pSStack_60 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSStack_60->strongRefCount = pSStack_60->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 1;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar5;
    local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_78.m_state)->strongRefCount = 0;
    (local_78.m_state)->weakRefCount = 0;
    (local_78.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    local_78.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    (local_78.m_state)->strongRefCount = 1;
    (local_78.m_state)->weakRefCount = 1;
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = pNVar4;
    (pNVar5->m_enclosingNode).m_state = local_80;
    if (local_80 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_80->strongRefCount = local_80->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar8 = *pdVar8 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 1;
    local_50.m_state = (SharedPtrStateBase *)0x0;
    local_50.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_50.m_state = pSVar6;
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar7,context,&local_78,&local_40,"float_struct");
    tcu::TestNode::addChild(pTVar3,(TestNode *)pRVar7);
    pRVar7 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar7,context,&local_50,&local_40,"float_array");
    tcu::TestNode::addChild(pTVar3,(TestNode *)pRVar7);
  }
  pSVar1 = local_50.m_state;
  pdVar8 = &pSVar6->strongRefCount;
  LOCK();
  *pdVar8 = *pdVar8 + -1;
  UNLOCK();
  if (*pdVar8 == 0) {
    local_50.m_ptr = (Node *)0x0;
    (*(local_50.m_state)->_vptr_SharedPtrStateBase[2])(local_50.m_state);
  }
  LOCK();
  pdVar8 = &pSVar1->weakRefCount;
  *pdVar8 = *pdVar8 + -1;
  UNLOCK();
  if ((*pdVar8 == 0) && (local_50.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_50.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  pSVar6 = local_78.m_state;
  if (local_78.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar8 = &(local_78.m_state)->strongRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
    }
    LOCK();
    pdVar8 = &pSVar6->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if ((*pdVar8 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  if (local_80 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar8 = &local_80->strongRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      (*local_80->_vptr_SharedPtrStateBase[2])(local_80);
    }
    LOCK();
    pdVar8 = &local_80->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if ((*pdVar8 == 0) && (local_80 != (SharedPtrStateBase *)0x0)) {
      (*local_80->_vptr_SharedPtrStateBase[1])();
    }
  }
  pSVar6 = pSStack_60;
  if (pSStack_60 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar8 = &pSStack_60->strongRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_68 = (Node *)0x0;
      (*pSStack_60->_vptr_SharedPtrStateBase[2])(pSStack_60);
    }
    LOCK();
    pdVar8 = &pSVar6->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if ((*pdVar8 == 0) && (pSStack_60 != (SharedPtrStateBase *)0x0)) {
      (*pSStack_60->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateUniformBlockOffsetContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup)
{
	const ProgramResourceQueryTestTarget	queryTarget			(PROGRAMINTERFACE_UNIFORM, PROGRAMRESOURCEPROP_OFFSET);
	const bool								isInterfaceBlock	= (parentStructure->getType() == ResourceDefinition::Node::TYPE_INTERFACE_BLOCK);
	const bool								namedNonArrayBlock	= isInterfaceBlock																					&&
																  static_cast<const ResourceDefinition::InterfaceBlock*>(parentStructure.get())->m_named			&&
																  parentStructure->getEnclosingNode()->getType() != ResourceDefinition::Node::TYPE_ARRAY_ELEMENT;

	if (!isInterfaceBlock)
	{
		// .types
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "types", "Types");
			targetGroup->addChild(blockGroup);

			generateVariableCases(context, parentStructure, blockGroup, queryTarget, 3, false);
			generateOpaqueTypeCases(context, parentStructure, blockGroup, queryTarget, 3, false);
		}

		// .aggregates
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "aggregates", "Aggregate types");
			targetGroup->addChild(blockGroup);

			// .atomic_uint_struct
			// .atomic_uint_array
			{
				const ResourceDefinition::Node::SharedPtr offset			(new ResourceDefinition::LayoutQualifier(parentStructure, glu::Layout(-1, -1, 4)));
				const ResourceDefinition::Node::SharedPtr arrayElement		(new ResourceDefinition::ArrayElement(offset));
				const ResourceDefinition::Node::SharedPtr elementVariable	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_UINT_ATOMIC_COUNTER));

				blockGroup->addChild(new ResourceTestCase(context, elementVariable, queryTarget, "atomic_uint_array"));
			}

			// .float_array
			// .float_struct
			{
				const ResourceDefinition::Node::SharedPtr structMember		(new ResourceDefinition::StructMember(parentStructure));
				const ResourceDefinition::Node::SharedPtr arrayElement		(new ResourceDefinition::ArrayElement(parentStructure));
				const ResourceDefinition::Node::SharedPtr memberVariable	(new ResourceDefinition::Variable(structMember, glu::TYPE_FLOAT));
				const ResourceDefinition::Node::SharedPtr elementVariable	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_FLOAT));

				blockGroup->addChild(new ResourceTestCase(context, memberVariable, queryTarget, "float_struct"));
				blockGroup->addChild(new ResourceTestCase(context, elementVariable, queryTarget, "float_array"));
			}
		}
	}
	else if (namedNonArrayBlock)
	{
		// .types
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "types", "Types");
			targetGroup->addChild(blockGroup);

			generateVariableCases(context, parentStructure, blockGroup, queryTarget, 3, false);
			generateOpaqueTypeCases(context, parentStructure, blockGroup, queryTarget, 3, false);
		}

		// .aggregates
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "aggregates", "Aggregate types");
			targetGroup->addChild(blockGroup);

			// .float_array
			// .float_struct
			{
				const ResourceDefinition::Node::SharedPtr structMember		(new ResourceDefinition::StructMember(parentStructure));
				const ResourceDefinition::Node::SharedPtr arrayElement		(new ResourceDefinition::StructMember(parentStructure));
				const ResourceDefinition::Node::SharedPtr memberVariable	(new ResourceDefinition::Variable(structMember, glu::TYPE_FLOAT));
				const ResourceDefinition::Node::SharedPtr elementVariable	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_FLOAT));

				blockGroup->addChild(new ResourceTestCase(context, memberVariable, queryTarget, "float_struct"));
				blockGroup->addChild(new ResourceTestCase(context, elementVariable, queryTarget, "float_array"));
			}
		}
	}
	else
	{
		generateVariableCases(context, parentStructure, targetGroup, queryTarget, 1);
		generateVariableArrayCases(context, parentStructure, targetGroup, queryTarget, 1);
		generateCompoundVariableCases(context, parentStructure, targetGroup, queryTarget, 1);
	}
}